

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

exr_result_t default_compress_chunk(exr_encode_pipeline_t *encode)

{
  exr_const_context_t p_Var1;
  long lVar2;
  exr_result_t eVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  code *UNRECOVERED_JUMPTABLE_00;
  
  p_Var1 = encode->context;
  if (p_Var1 == (exr_const_context_t)0x0) {
    return 2;
  }
  uVar5 = (ulong)encode->part_index;
  if (((long)uVar5 < 0) || (*(int *)(p_Var1 + 0xc4) <= encode->part_index)) {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(p_Var1 + 0x48);
    pcVar6 = "Part index (%d) out of range";
    uVar7 = 4;
  }
  else {
    lVar2 = *(long *)(*(long *)(p_Var1 + 0x1d8) + uVar5 * 8);
    sVar4 = exr_compress_max_buffer_size(encode->packed_bytes);
    eVar3 = internal_encode_alloc_buffer
                      (encode,EXR_TRANSCODE_BUFFER_COMPRESSED,&encode->compressed_buffer,
                       &encode->compressed_alloc_size,sVar4);
    if (eVar3 != 0) {
      UNRECOVERED_JUMPTABLE_00 = *(code **)(p_Var1 + 0x48);
      sVar4 = exr_compress_max_buffer_size(encode->packed_bytes);
      eVar3 = (*UNRECOVERED_JUMPTABLE_00)
                        (p_Var1,eVar3,"error allocating buffer %lu",sVar4,UNRECOVERED_JUMPTABLE_00);
      return eVar3;
    }
    uVar5 = (ulong)*(uint *)(lVar2 + 0xb0);
    switch(uVar5) {
    case 0:
      eVar3 = (**(code **)(p_Var1 + 0x40))
                        (p_Var1,3,"no compression set but still trying to compress");
      return eVar3;
    case 1:
      eVar3 = internal_exr_apply_rle(encode);
      return eVar3;
    case 2:
    case 3:
      eVar3 = internal_exr_apply_zip(encode);
      return eVar3;
    case 4:
      eVar3 = internal_exr_apply_piz(encode);
      return eVar3;
    case 5:
      eVar3 = internal_exr_apply_pxr24(encode);
      return eVar3;
    case 6:
      eVar3 = internal_exr_apply_b44(encode);
      return eVar3;
    case 7:
      eVar3 = internal_exr_apply_b44a(encode);
      return eVar3;
    case 8:
      eVar3 = internal_exr_apply_dwaa(encode);
      return eVar3;
    case 9:
      eVar3 = internal_exr_apply_dwab(encode);
      return eVar3;
    default:
      UNRECOVERED_JUMPTABLE_00 = *(code **)(p_Var1 + 0x48);
      pcVar6 = "Compression technique 0x%02X invalid";
      uVar7 = 3;
    }
  }
  eVar3 = (*UNRECOVERED_JUMPTABLE_00)(p_Var1,uVar7,pcVar6,uVar5,UNRECOVERED_JUMPTABLE_00);
  return eVar3;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

static exr_result_t
default_compress_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
        encode->context, encode->part_index);

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_COMPRESSED,
        &(encode->compressed_buffer),
        &(encode->compressed_alloc_size),
        exr_compress_max_buffer_size( encode->packed_bytes ));
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->print_error (
            pctxt,
            rv,
            "error allocating buffer %lu",
            exr_compress_max_buffer_size (encode->packed_bytes));
    //return rv;

    switch (part->comp_type)
    {
        case EXR_COMPRESSION_NONE:
            return pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "no compression set but still trying to compress");

        case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;
        case EXR_COMPRESSION_PIZ: rv = internal_exr_apply_piz (encode); break;
        case EXR_COMPRESSION_PXR24:
            rv = internal_exr_apply_pxr24 (encode);
            break;
        case EXR_COMPRESSION_B44: rv = internal_exr_apply_b44 (encode); break;
        case EXR_COMPRESSION_B44A: rv = internal_exr_apply_b44a (encode); break;
        case EXR_COMPRESSION_DWAA: rv = internal_exr_apply_dwaa (encode); break;
        case EXR_COMPRESSION_DWAB: rv = internal_exr_apply_dwab (encode); break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Compression technique 0x%02X invalid",
                (int) part->comp_type);
    }
    return rv;
}